

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLSetImplement.h
# Opt level: O3

void * __thiscall
STLSetImplement<std::set<int,_std::less<int>,_std::allocator<int>_>,_KDefectiveSimple>::newSet
          (STLSetImplement<std::set<int,_std::less<int>,_std::allocator<int>_>,_KDefectiveSimple>
           *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x30);
  puVar1[2] = 0;
  puVar1[3] = 0;
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[3] = puVar1 + 1;
  puVar1[4] = puVar1 + 1;
  puVar1[5] = 0;
  return puVar1;
}

Assistant:

void* STLSetImplement<Set, Base>::newSet() {
	return new Set();
}